

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewLogger(PosixEnv *this,string *filename,Logger **result)

{
  int __fd;
  FILE *pFVar1;
  undefined8 *puVar2;
  int *piVar3;
  undefined8 *in_RCX;
  
  __fd = open((char *)*result,0x80441,0x1a4);
  if (-1 < __fd) {
    pFVar1 = fdopen(__fd,"w");
    if (pFVar1 != (FILE *)0x0) {
      puVar2 = (undefined8 *)operator_new(0x10);
      *puVar2 = &PTR__PosixLogger_001760d8;
      puVar2[1] = pFVar1;
      *in_RCX = puVar2;
      (this->super_Env)._vptr_Env = (_func_int **)0x0;
      return (Status)(char *)this;
    }
    close(__fd);
  }
  *in_RCX = 0;
  piVar3 = __errno_location();
  PosixError((anon_unknown_1 *)this,(string *)result,*piVar3);
  return (Status)(char *)this;
}

Assistant:

Status NewLogger(const std::string& filename, Logger** result) override {
    int fd = ::open(filename.c_str(),
                    O_APPEND | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    std::FILE* fp = ::fdopen(fd, "w");
    if (fp == nullptr) {
      ::close(fd);
      *result = nullptr;
      return PosixError(filename, errno);
    } else {
      *result = new PosixLogger(fp);
      return Status::OK();
    }
  }